

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall google::protobuf::DescriptorPool::Tables::FindSymbol(Tables *this,StringPiece key)

{
  bool bVar1;
  reference local_80;
  _Node_iterator_base<google::protobuf::Symbol,_true> local_68;
  Symbol local_60;
  _Node_iterator_base<google::protobuf::Symbol,_true> local_58;
  const_iterator it;
  QueryKey name;
  Tables *this_local;
  StringPiece key_local;
  
  Symbol::QueryKey::QueryKey((QueryKey *)&it);
  Symbol::Symbol(&local_60,(QueryKey *)&it);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
       ::find(&this->symbols_by_name_,&local_60);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
       ::end(&this->symbols_by_name_);
  bVar1 = std::__detail::operator==(&local_58,&local_68);
  if (bVar1) {
    local_80 = (reference)&(anonymous_namespace)::kNullSymbol;
  }
  else {
    local_80 = std::__detail::_Node_const_iterator<google::protobuf::Symbol,_true,_true>::operator*
                         ((_Node_const_iterator<google::protobuf::Symbol,_true,_true> *)&local_58);
  }
  return (Symbol)local_80->ptr_;
}

Assistant:

inline Symbol DescriptorPool::Tables::FindSymbol(StringPiece key) const {
  Symbol::QueryKey name;
  name.name = key;
  auto it = symbols_by_name_.find(Symbol(&name));
  return it == symbols_by_name_.end() ? kNullSymbol : *it;
}